

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::tuple<const_mp::NLProblemInfo_&>_&> *
testing::A<std::tuple<mp::NLProblemInfo_const&>const&>(void)

{
  void *__s;
  Matcher<const_std::tuple<const_mp::NLProblemInfo_&>_&> *in_RDI;
  MatcherInterface<const_std::tuple<const_mp::NLProblemInfo_&>_&> *in_stack_ffffffffffffffd8;
  Matcher<const_std::tuple<const_mp::NLProblemInfo_&>_&> *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::AnyMatcherImpl<const_std::tuple<const_mp::NLProblemInfo_&>_&>::AnyMatcherImpl
            ((AnyMatcherImpl<const_std::tuple<const_mp::NLProblemInfo_&>_&> *)this);
  MakeMatcher<std::tuple<mp::NLProblemInfo_const&>const&>(in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }